

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_lswx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *tcg_ctx_01;
  uint uVar1;
  uintptr_t o_7;
  TCGTemp *pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  TCGv_i64 arg;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_1;
  uintptr_t o_5;
  uintptr_t o_6;
  uintptr_t o;
  TCGv_i64 ret;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  if (ctx->le_mode == true) {
    gen_exception_err(ctx,5,ctx->opcode & 0x3ff0000 | 3);
    return;
  }
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x20
                     );
    ctx->access_type = 0x20;
  }
  pTVar2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx_00);
  tcg_ctx_01 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0x10 & 0x1f;
  arg = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar1 == 0) {
    if (ctx->sf_mode != false) {
      if (arg != ret) {
        tcg_gen_op2_ppc64(tcg_ctx_01,INDEX_op_mov_i64,(TCGArg)((long)tcg_ctx_01 + (long)ret),
                          (TCGArg)(arg + (long)tcg_ctx_01));
      }
      goto LAB_00b9411d;
    }
  }
  else {
    tcg_gen_op3_ppc64(tcg_ctx_01,INDEX_op_add_i64,(TCGArg)((long)tcg_ctx_01 + (long)ret),
                      (TCGArg)((long)&tcg_ctx_01->pool_cur + (long)cpu_gpr[uVar1]),
                      (TCGArg)(arg + (long)tcg_ctx_01));
    arg = ret;
    if (ctx->sf_mode != false) goto LAB_00b9411d;
  }
  tcg_gen_ext32u_i64_ppc64(tcg_ctx_01,ret,arg);
LAB_00b9411d:
  pTVar3 = tcg_const_i32_ppc64(tcg_ctx_00,ctx->opcode >> 0x15 & 0x1f);
  pTVar4 = tcg_const_i32_ppc64(tcg_ctx_00,*(ushort *)((long)&ctx->opcode + 2) & 0x1f);
  pTVar5 = tcg_const_i32_ppc64(tcg_ctx_00,ctx->opcode >> 0xb & 0x1f);
  local_58 = (TCGTemp *)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00);
  local_50 = (TCGTemp *)(ret + (long)tcg_ctx_00);
  local_48 = (TCGTemp *)(pTVar3 + (long)tcg_ctx_00);
  local_40 = (TCGTemp *)(pTVar4 + (long)tcg_ctx_00);
  local_38 = (TCGTemp *)(pTVar5 + (long)tcg_ctx_00);
  tcg_gen_callN_ppc64(tcg_ctx_00,helper_lswx_ppc64,(TCGTemp *)0x0,5,&local_58);
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(pTVar3 + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(pTVar4 + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(pTVar5 + (long)tcg_ctx_00));
  return;
}

Assistant:

static void gen_lswx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv_i32 t1, t2, t3;

    if (ctx->le_mode) {
        gen_align_no_le(ctx);
        return;
    }
    gen_set_access_type(ctx, ACCESS_INT);
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    t1 = tcg_const_i32(tcg_ctx, rD(ctx->opcode));
    t2 = tcg_const_i32(tcg_ctx, rA(ctx->opcode));
    t3 = tcg_const_i32(tcg_ctx, rB(ctx->opcode));
    gen_helper_lswx(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2, t3);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
}